

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

uc_err uc_gen_tb(uc_struct_conflict15 *uc,uint64_t addr,uc_tb *out_tb)

{
  uint uVar1;
  CPUState *cpu;
  TranslationBlock *pTVar2;
  uc_err uVar3;
  uint uVar4;
  uint uVar5;
  uint pc;
  
  cpu = uc->cpu;
  pc = (uint)addr;
  uVar4 = (uint)(addr >> 8) & 0xffffff ^ pc;
  uVar5 = uVar4 & 0x3f | uVar4 >> 8 & 0xfc0;
  pTVar2 = cpu->tb_jmp_cache[uVar5];
  uVar4 = 0;
  if (cpu->cflags_next_tb != 0xffffffff) {
    uVar4 = cpu->cflags_next_tb & 0xffffff;
  }
  uVar4 = cpu->cluster_index << 0x18 | uVar4;
  if ((((pTVar2 == (TranslationBlock *)0x0) || ((uint)pTVar2->pc != pc)) ||
      (*(int *)((long)&pTVar2->pc + 4) != 0)) ||
     ((((int)pTVar2->cs_base != 0 ||
       (uVar1._0_2_ = pTVar2->size, uVar1._2_2_ = pTVar2->icount,
       cpu->trace_dstate[0] != (ulong)uVar1)) || ((pTVar2->flags & 0xff0effff) != uVar4)))) {
    pTVar2 = tb_htable_lookup_tricore(cpu,addr & 0xffffffff,0,0,uVar4);
    cpu->tb_jmp_cache[uVar5] = pTVar2;
    if (pTVar2 == (TranslationBlock *)0x0) {
      pTVar2 = (TranslationBlock *)tb_gen_code_tricore(cpu,pc,0,0,uVar4);
      cpu->tb_jmp_cache[uVar5] = pTVar2;
    }
  }
  if (pTVar2 == (TranslationBlock *)0x0) {
    uVar3 = UC_ERR_NOMEM;
  }
  else {
    uVar3 = UC_ERR_OK;
    if (out_tb != (uc_tb *)0x0) {
      out_tb->pc = (ulong)(uint)pTVar2->pc;
      out_tb->icount = *(uint16_t *)((long)&pTVar2->cs_base + 6);
      out_tb->size = *(uint16_t *)((long)&pTVar2->cs_base + 4);
      uVar3 = UC_ERR_OK;
    }
  }
  return uVar3;
}

Assistant:

static uc_err uc_gen_tb(struct uc_struct *uc, uint64_t addr, uc_tb *out_tb) 
{
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    CPUState *cpu = uc->cpu;
    CPUArchState *env = (CPUArchState *)cpu->env_ptr;
    uint32_t flags;
    uint32_t hash;
    uint32_t cflags = cpu->cflags_next_tb;

    if (cflags == -1) {
        cflags = curr_cflags();
    }

    cpu_get_tb_cpu_state(env, &pc, &cs_base, &flags);

    // Unicorn: Our hack here.
    pc = addr;

    hash = tb_jmp_cache_hash_func(env->uc, pc);
    tb = cpu->tb_jmp_cache[hash];

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    if (unlikely(!(tb &&
                   tb->pc == pc &&
                   tb->cs_base == cs_base &&
                   tb->flags == flags &&
                   tb->trace_vcpu_dstate == *cpu->trace_dstate &&
                   (tb_cflags(tb) & (CF_HASH_MASK | CF_INVALID)) == cflags))) {

        tb = tb_htable_lookup(cpu, pc, cs_base, flags, cflags);
        cpu->tb_jmp_cache[hash] = tb;

        if (tb == NULL) {
            mmap_lock();
            tb = tb_gen_code(cpu, pc, cs_base, flags, cflags);
            mmap_unlock();
            /* We add the TB in the virtual pc hash table for the fast lookup */
            cpu->tb_jmp_cache[hash] = tb;
        }
    }

    // If we still couldn't generate a TB, it must be out of memory.
    if (tb == NULL) {
        return UC_ERR_NOMEM;
    }

    if (out_tb != NULL) {
        UC_TB_COPY(out_tb, tb);
    }

    return UC_ERR_OK;
}